

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<float> * __thiscall
Fad<float>::operator+=(Fad<float> *this,FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  ulong uVar5;
  int i;
  uint ssize;
  ulong uVar6;
  value_type vVar7;
  
  uVar1 = (((x->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((x->fadexpr_).right_)->dx_).num_elts;
  ssize = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    ssize = uVar1;
  }
  if (ssize != 0) {
    uVar3 = (this->dx_).num_elts;
    if (uVar3 == 0) {
      Vector<float>::resize(&this->dx_,ssize);
      pfVar4 = (this->dx_).ptr_to_data;
      if (((((x->fadexpr_).left_)->dx_).num_elts == 0) ||
         ((((x->fadexpr_).right_)->dx_).num_elts == 0)) {
        uVar6 = 0;
        uVar5 = (ulong)ssize;
        if ((int)ssize < 1) {
          uVar5 = uVar6;
        }
        for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          vVar7 = FadBinaryDiv<Fad<float>,_Fad<float>_>::dx(&x->fadexpr_,(int)uVar6);
          pfVar4[uVar6] = vVar7;
        }
      }
      else {
        uVar6 = 0;
        uVar5 = (ulong)ssize;
        if ((int)ssize < 1) {
          uVar5 = uVar6;
        }
        for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          vVar7 = FadBinaryDiv<Fad<float>,_Fad<float>_>::fastAccessDx(&x->fadexpr_,(int)uVar6);
          pfVar4[uVar6] = vVar7;
        }
      }
    }
    else {
      pfVar4 = (this->dx_).ptr_to_data;
      uVar5 = 0;
      if (0 < (int)uVar3) {
        uVar5 = (ulong)uVar3;
      }
      uVar6 = 0;
      if (uVar1 == 0 || uVar2 == 0) {
        for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          vVar7 = FadBinaryDiv<Fad<float>,_Fad<float>_>::dx(&x->fadexpr_,(int)uVar6);
          pfVar4[uVar6] = vVar7 + pfVar4[uVar6];
        }
      }
      else {
        for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          vVar7 = FadBinaryDiv<Fad<float>,_Fad<float>_>::fastAccessDx(&x->fadexpr_,(int)uVar6);
          pfVar4[uVar6] = vVar7 + pfVar4[uVar6];
        }
      }
    }
  }
  this->val_ = ((x->fadexpr_).left_)->val_ / ((x->fadexpr_).right_)->val_ + this->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}